

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flux_test.cpp
# Opt level: O3

void flux_test::clearTarget(void)

{
  SystemImpl *this;
  FlowImpl *this_00;
  long lVar1;
  
  this = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this);
  this_00 = (FlowImpl *)operator_new(0x38);
  FlowImpl::FlowImpl(this_00);
  *(undefined ***)this_00 = &PTR_execute_00106cb0;
  FlowImpl::setTarget((System *)this_00);
  (**(code **)(*(long *)this_00 + 0x20))(this_00);
  lVar1 = (**(code **)(*(long *)this_00 + 0x10))(this_00);
  if (lVar1 == 0) {
    return;
  }
  __assert_fail("flux->getTarget() == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/unit_tests/flux_test.cpp"
                ,0x33,"static void flux_test::clearTarget()");
}

Assistant:

void flux_test::clearTarget() {
    auto *s1 = new SystemImpl();
    auto *flux = new FlowExp();
    flux->setTarget(s1);
    flux->clearTarget();
    assert(flux->getTarget() == nullptr);
}